

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_goesr.cc
# Opt level: O0

void __thiscall GOESRImageHandler::handle(GOESRImageHandler *this,shared_ptr<const_lrit::File> *f)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  uint16_t uVar5;
  uint uVar6;
  GOESRProduct *in_RSI;
  long in_RDI;
  GOESRProduct *in_stack_00000058;
  GOESRImageHandler *in_stack_00000060;
  shared_ptr<const_lrit::File> *in_stack_000001d8;
  GOESRProduct *in_stack_000001e0;
  mapped_type *product;
  GOESRProduct *product_1;
  iterator it;
  SegmentKey key;
  GOESRProduct tmp;
  uint16_t pid;
  NOAALRITHeader nlh;
  PrimaryHeader ph;
  GOESRProduct *in_stack_fffffffffffffa58;
  GOESRProduct *in_stack_fffffffffffffa60;
  mapped_type *in_stack_fffffffffffffa78;
  undefined4 in_stack_fffffffffffffa80;
  undefined2 in_stack_fffffffffffffa84;
  undefined2 in_stack_fffffffffffffa86;
  GOESRProduct *in_stack_fffffffffffffa88;
  undefined5 in_stack_fffffffffffffaa8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffad0;
  GOESRProduct *in_stack_fffffffffffffad8;
  _Node_iterator_base<std::pair<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_GOESRProduct>,_true>
  local_3b0;
  _Node_iterator_base<std::pair<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_GOESRProduct>,_true>
  local_3a8 [60];
  uint local_1c8;
  GOESRProduct local_1b8;
  uint16_t local_3a;
  NOAALRITHeader local_38;
  char local_24;
  
  std::__shared_ptr_access<const_lrit::File,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_lrit::File,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x29e08b);
  lrit::File::getHeader<lrit::PrimaryHeader>((File *)in_stack_fffffffffffffa60);
  if (local_24 == '\0') {
    std::__shared_ptr_access<const_lrit::File,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<const_lrit::File,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x29e0b7);
    local_38 = lrit::File::getHeader<lrit::NOAALRITHeader>((File *)0x29e0bf);
    local_3a = local_38.productID;
    if ((((local_38.productID == 0x10) || (local_38.productID == 0x11)) ||
        (local_38.productID == 0x12)) || (local_38.productID == 0x13)) {
      std::__shared_ptr_access<const_lrit::File,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_lrit::File,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x29e122);
      bVar1 = lrit::File::hasHeader<lrit::AncillaryTextHeader>((File *)0x29e12a);
      if (bVar1) {
        GOESRProduct::GOESRProduct(in_stack_000001e0,in_stack_000001d8);
        bVar1 = GOESRProduct::matchSatelliteID(&local_1b8,*(int *)(in_RDI + 0x1f8));
        if (((bVar1) &&
            (uVar2 = GOESRProduct::matchProduct(in_stack_fffffffffffffad8,in_stack_fffffffffffffad0)
            , (bool)uVar2)) &&
           ((uVar3 = GOESRProduct::matchRegion
                               (in_stack_fffffffffffffa88,
                                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)CONCAT26(in_stack_fffffffffffffa86,
                                            CONCAT24(in_stack_fffffffffffffa84,
                                                     in_stack_fffffffffffffa80))), (bool)uVar3 &&
            (uVar4 = GOESRProduct::matchChannel
                               (in_stack_fffffffffffffa88,
                                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)CONCAT26(in_stack_fffffffffffffa86,
                                            CONCAT24(in_stack_fffffffffffffa84,
                                                     in_stack_fffffffffffffa80))), (bool)uVar4)))) {
          bVar1 = GOESRProduct::isSegmented(&local_1b8);
          if (bVar1) {
            std::__shared_ptr_access<const_lrit::File,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<const_lrit::File,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x29e287);
            bVar1 = lrit::File::hasHeader<lrit::SegmentIdentificationHeader>((File *)0x29e28f);
            if (bVar1) {
              GOESRProduct::generateKey_abi_cxx11_(in_stack_fffffffffffffa58);
              local_3a8[0]._M_cur =
                   (__node_type *)
                   std::
                   unordered_map<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_GOESRProduct,_SegmentKeyHash,_std::equal_to<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_GOESRProduct>_>_>
                   ::find((unordered_map<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_GOESRProduct,_SegmentKeyHash,_std::equal_to<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_GOESRProduct>_>_>
                           *)in_stack_fffffffffffffa58,(key_type *)0x29e2df);
              local_3b0._M_cur =
                   (__node_type *)
                   std::
                   unordered_map<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_GOESRProduct,_SegmentKeyHash,_std::equal_to<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_GOESRProduct>_>_>
                   ::end((unordered_map<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_GOESRProduct,_SegmentKeyHash,_std::equal_to<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_GOESRProduct>_>_>
                          *)in_stack_fffffffffffffa58);
              bVar1 = std::__detail::operator==(local_3a8,&local_3b0);
              if (bVar1) {
                std::
                unordered_map<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_GOESRProduct,_SegmentKeyHash,_std::equal_to<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_GOESRProduct>_>_>
                ::operator[]((unordered_map<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_GOESRProduct,_SegmentKeyHash,_std::equal_to<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_GOESRProduct>_>_>
                              *)in_stack_fffffffffffffa60,(key_type *)in_stack_fffffffffffffa58);
                GOESRProduct::operator=(in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
              }
              else {
                std::__detail::
                _Node_iterator<std::pair<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_GOESRProduct>,_false,_true>
                ::operator->((_Node_iterator<std::pair<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_GOESRProduct>,_false,_true>
                              *)0x29e384);
                uVar5 = GOESRProduct::imageIdentifier
                                  ((GOESRProduct *)
                                   CONCAT26(in_stack_fffffffffffffa86,
                                            CONCAT24(in_stack_fffffffffffffa84,
                                                     in_stack_fffffffffffffa80)));
                uVar6 = (uint)uVar5;
                uVar5 = GOESRProduct::imageIdentifier
                                  ((GOESRProduct *)
                                   CONCAT26(uVar5,CONCAT24(in_stack_fffffffffffffa84,uVar6)));
                if (uVar6 == uVar5) {
                  GOESRProduct::add(in_RSI,(shared_ptr<const_lrit::File> *)
                                           CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,
                                                  in_stack_fffffffffffffaa8))));
                }
                else {
                  in_stack_fffffffffffffa78 =
                       std::
                       unordered_map<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_GOESRProduct,_SegmentKeyHash,_std::equal_to<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_GOESRProduct>_>_>
                       ::operator[]((unordered_map<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_GOESRProduct,_SegmentKeyHash,_std::equal_to<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_GOESRProduct>_>_>
                                     *)in_stack_fffffffffffffa60,
                                    (key_type *)in_stack_fffffffffffffa58);
                  GOESRProduct::operator=(in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
                }
              }
              std::
              unordered_map<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_GOESRProduct,_SegmentKeyHash,_std::equal_to<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_GOESRProduct>_>_>
              ::operator[]((unordered_map<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_GOESRProduct,_SegmentKeyHash,_std::equal_to<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_GOESRProduct>_>_>
                            *)in_stack_fffffffffffffa60,(key_type *)in_stack_fffffffffffffa58);
              bVar1 = GOESRProduct::isComplete(in_stack_fffffffffffffa78);
              if (bVar1) {
                in_stack_fffffffffffffa60 = (GOESRProduct *)&stack0xfffffffffffffac8;
                GOESRProduct::GOESRProduct(in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
                handleImage(in_stack_00000060,in_stack_00000058);
                GOESRProduct::~GOESRProduct(in_stack_fffffffffffffa60);
                std::
                unordered_map<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_GOESRProduct,_SegmentKeyHash,_std::equal_to<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_GOESRProduct>_>_>
                ::erase((unordered_map<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_GOESRProduct,_SegmentKeyHash,_std::equal_to<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_GOESRProduct>_>_>
                         *)in_stack_fffffffffffffa60,(key_type *)in_stack_fffffffffffffa58);
              }
              local_1c8 = (uint)bVar1;
              std::
              tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~tuple((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)0x29e4fa);
            }
            else {
              local_1c8 = 1;
            }
          }
          else {
            GOESRProduct::GOESRProduct(in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
            handleImage(in_stack_00000060,in_stack_00000058);
            GOESRProduct::~GOESRProduct(in_stack_fffffffffffffa60);
            local_1c8 = 1;
          }
        }
        else {
          local_1c8 = 1;
        }
        GOESRProduct::~GOESRProduct(in_stack_fffffffffffffa60);
      }
    }
  }
  return;
}

Assistant:

void GOESRImageHandler::handle(std::shared_ptr<const lrit::File> f) {
  auto ph = f->getHeader<lrit::PrimaryHeader>();
  if (ph.fileType != 0) {
    return;
  }

  // Filter by product
  //
  // The NOAA product ID is equal to the GOES satellite number.
  // This is true for LRIT files from both GOES-16 and GOES-17,
  // which is reason to believe it will hold true for GOES-18
  // and GOES-19 as well (also see issue #122).
  //
  // Actual filtering based on satellite is done based on the details
  // encoded in the ancillary data field.
  //
  auto nlh = f->getHeader<lrit::NOAALRITHeader>();
  auto pid = nlh.productID;
  if (!(pid == 16 || pid == 17 || pid == 18 || pid == 19)) {
    return;
  }

  // Require presence of ancillary text header.
  //
  // The details expect this header to be present. It appears not to
  // be present on products other than cloud and moisture image
  // products (included in the HRIT stream starting late May 2018).
  //
  // The first GOES-16 image file that did not have this header was
  // named: OR_ABI-L2-RRQPEF-M3_G16_[...]_rescaled.lrit and I saw it
  // on the stream on 2018-05-21T18:50:00Z.
  //
  if (!f->hasHeader<lrit::AncillaryTextHeader>()) {
    return;
  }

  auto tmp = GOESRProduct(f);

  // Filter by product details
  if (!tmp.matchSatelliteID(satelliteID_) ||
      !tmp.matchProduct(config_.products) ||
      !tmp.matchRegion(config_.regions) ||
      !tmp.matchChannel(config_.channels)) {
    return;
  }

  // If this is not a segmented image we can post process immediately
  if (!tmp.isSegmented()) {
    handleImage(std::move(tmp));
    return;
  }

  // For consistency, assume that every file where the details
  // indicate it is part of a segmented image has a segment
  // identification header.
  if (!f->hasHeader<lrit::SegmentIdentificationHeader>()) {
    return;
  }

  const auto key = tmp.generateKey();

  // Find existing product with this region and channel
  auto it = products_.find(key);
  if (it == products_.end()) {
    // No existing product found; use this one as the first one
    products_[key] = std::move(tmp);
  } else {
    // If the current segment has the same image identifier as the
    // segments we have seen before, add it. Otherwise, we can
    // safely assume the existing image is incomplete and we drop it.
    auto& product = it->second;
    if (product.imageIdentifier() == tmp.imageIdentifier()) {
      product.add(f);
    } else {
      // TODO: Log that we drop the existing image
      products_[key] = std::move(tmp);
    }
  }

  // If the product is complete we can post process it
  auto& product = products_[key];
  if (product.isComplete()) {
    handleImage(std::move(product));
    products_.erase(key);
    return;
  }
}